

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.hh
# Opt level: O2

void __thiscall Pl_ASCII85Decoder::~Pl_ASCII85Decoder(Pl_ASCII85Decoder *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x50);
  return;
}

Assistant:

~Pl_ASCII85Decoder() final = default;